

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_sequence<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  SequenceBegin sb;
  RepeatBegin RVar1;
  RepeatEnd re;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  size_t extraout_RDX;
  uint uVar5;
  detail *this;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tags;
  undefined4 uStack_74;
  undefined4 uStack_5c;
  
  uVar3 = (ulong)(tag._len != 0);
  this = (detail *)(tag._ptr + uVar3);
  binlog::Range::throw_if_overflow(istream,4);
  uVar5 = *(uint *)istream->_begin;
  istream->_begin = (char *)((long)istream->_begin + 4);
  tags._len = extraout_RDX;
  tags._ptr = (char *)(tag._len - uVar3);
  sVar4 = tag_first_size(this,tags);
  sb.tag._ptr = (char *)this;
  sb.size = (ulong)uVar5;
  sb.tag._len = sVar4;
  bVar2 = binlog::ToStringVisitor::visit(visitor,sb,istream);
  if (bVar2) {
    return;
  }
  if (uVar5 < 0x21) {
    if (uVar5 == 0) goto LAB_00107fe1;
  }
  else {
    tag_00._len = sVar4;
    tag_00._ptr = (char *)this;
    bVar2 = singular_impl(full_tag,tag_00,max_recursion);
    if (bVar2) {
      RVar1._4_4_ = uStack_5c;
      RVar1.size = uVar5;
      RVar1.tag._ptr = (char *)this;
      RVar1.tag._len = sVar4;
      binlog::ToStringVisitor::visit(visitor,RVar1);
      tag_01._len = sVar4;
      tag_01._ptr = (char *)this;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag,tag_01,visitor,istream,max_recursion);
      re._4_4_ = uStack_74;
      re.size = uVar5;
      re.tag._ptr = (char *)this;
      re.tag._len = sVar4;
      binlog::ToStringVisitor::visit(visitor,re);
      goto LAB_00107fe1;
    }
  }
  do {
    tag_02._len = sVar4;
    tag_02._ptr = (char *)this;
    visit_impl<binlog::ToStringVisitor,binlog::Range>(full_tag,tag_02,visitor,istream,max_recursion)
    ;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
LAB_00107fe1:
  binlog::ToStringVisitor::visit(visitor);
  return;
}

Assistant:

void visit_sequence(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop [

  std::uint32_t size;
  mserialize::deserialize(size, istream);
  const string_view elem_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::SequenceBegin{size, elem_tag}, istream);
  if (skip) { return; }

  if (size > 32 && singular(full_tag, elem_tag, max_recursion))
  {
    // every elem in the seq are the same and serialized using 0 bytes.
    // visit the first one only, to prevent little input generating huge output
    visitor.visit(mserialize::Visitor::RepeatBegin{size, elem_tag});
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    visitor.visit(mserialize::Visitor::RepeatEnd{size, elem_tag});
  }
  else
  {
    while (size--)
    {
      visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    }
  }

  visitor.visit(mserialize::Visitor::SequenceEnd{});
}